

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  TableEntryPtr TVar2;
  KeyNode *node_00;
  NodeBase *pNVar3;
  bool bVar4;
  uint uVar5;
  uint extraout_EAX;
  map_index_t b_00;
  TableEntryPtr *pTVar6;
  MixingHashState MVar7;
  void *__s;
  ulong n;
  unsigned_long *puVar9;
  UntypedMapBase *this_00;
  ulong uVar10;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  long lVar11;
  ViewType k;
  ViewType k_00;
  NodeAndBucket NVar12;
  NodeBase aNStack_98 [2];
  UntypedMapBase *pUStack_88;
  TableEntryPtr *pTStack_78;
  unsigned_long auStack_70 [2];
  UntypedMapBase *pUStack_60;
  ulong uStack_58;
  undefined1 auStack_28 [16];
  NodeBase *pNVar8;
  
  this_00 = (UntypedMapBase *)auStack_28;
  uVar10 = (ulong)b;
  uVar5 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar5 == (this->super_UntypedMapBase).num_buckets_) ||
     ((this->super_UntypedMapBase).table_[uVar5] != 0)) {
    pNVar8 = node[2].super_NodeBase.next;
    k._M_str = (char *)node[1].super_NodeBase.next;
    k._M_len = (size_t)pNVar8;
    NVar12 = FindHelper(this,k,(TreeIterator *)0x0);
    if (NVar12.node == (NodeBase *)0x0) {
      TVar2 = (this->super_UntypedMapBase).table_[uVar10];
      if (TVar2 == 0) {
        UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
        uVar5 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar5 < b) {
          b = uVar5;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
        return;
      }
      if ((TVar2 & 1) == 0) {
        bVar4 = UntypedMapBase::TableEntryIsTooLong(&this->super_UntypedMapBase,b);
        if (!bVar4) {
          UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
          return;
        }
      }
      UntypedMapBase::InsertUniqueInTree
                (&this->super_UntypedMapBase,b,NodeToVariantKey,&node->super_NodeBase);
      return;
    }
    b = (map_index_t)pNVar8;
    KeyMapBase<std::__cxx11::string>::InsertUnique(auStack_28);
  }
  KeyMapBase<std::__cxx11::string>::InsertUnique(auStack_28);
  uVar5 = this_00->num_buckets_;
  uStack_58 = uVar10;
  if (uVar5 == 1) {
    this_00->index_of_first_non_null_ = 2;
    this_00->num_buckets_ = 2;
    pUStack_88 = (UntypedMapBase *)0x1c2acb;
    pTVar6 = UntypedMapBase::CreateEmptyTable(this_00,2);
    this_00->table_ = pTVar6;
    auStack_70[0] = rdtsc();
    pUStack_88 = (UntypedMapBase *)0x1c2afd;
    pUStack_60 = this_00;
    MVar7 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       auStack_70,&this_00->table_,&pUStack_60);
    this_00->seed_ = (map_index_t)MVar7.state_;
    return;
  }
  if (1 < b) {
    pTStack_78 = this_00->table_;
    this_00->num_buckets_ = b;
    pUStack_88 = (UntypedMapBase *)0x1c2b2c;
    pTVar6 = UntypedMapBase::CreateEmptyTable(this_00,b);
    this_00->table_ = pTVar6;
    uVar1 = this_00->index_of_first_non_null_;
    this_00->index_of_first_non_null_ = this_00->num_buckets_;
    pTVar6 = pTStack_78;
    if (uVar1 < uVar5) {
      lVar11 = 0;
      do {
        node_00 = (KeyNode *)pTVar6[(ulong)uVar1 + lVar11];
        if (((ulong)node_00 & 1) == 0 && node_00 != (KeyNode *)0x0) {
          pUStack_88 = (UntypedMapBase *)0x1c2b71;
          TransferList((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00,node_00);
        }
        else if (((ulong)node_00 & 1) != 0) {
          pUStack_88 = (UntypedMapBase *)0x1c2b87;
          UntypedMapBase::TransferTree
                    (this_00,(Tree *)((long)&node_00[-1].super_NodeBase.next + 7),NodeToVariantKey);
        }
        lVar11 = lVar11 + 1;
      } while (uVar5 - uVar1 != (int)lVar11);
    }
    UntypedMapBase::DeleteTable(this_00,pTStack_78,uVar5);
    return;
  }
  puVar9 = auStack_70;
  uVar10 = (ulong)b;
  pUStack_88 = (UntypedMapBase *)0x1c2bbb;
  KeyMapBase<std::__cxx11::string>::Resize();
  pNVar8 = aNStack_98;
  uVar5 = (uint)puVar9;
  pUStack_88 = this_00;
  if (uVar5 < 2) {
    UntypedMapBase::CreateEmptyTable();
    uVar5 = extraout_EAX;
  }
  else {
    uVar5 = uVar5 - 1 & uVar5;
    if (uVar5 == 0) {
      n = ((ulong)puVar9 & 0xffffffff) << 3;
      if (*(Arena **)(uVar10 + 0x18) == (Arena *)0x0) {
        __s = operator_new(n);
      }
      else {
        __s = Arena::AllocateForArray(*(Arena **)(uVar10 + 0x18),n);
      }
      memset(__s,0,n);
      return;
    }
  }
  this_01 = (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(ulong)uVar5;
  UntypedMapBase::CreateEmptyTable();
  do {
    pNVar3 = ((NodeBase *)&pNVar8->next)->next;
    k_00._M_str = (char *)pNVar8[1].next;
    k_00._M_len = (size_t)pNVar8[2].next;
    b_00 = BucketNumber(this_01,k_00);
    InsertUnique(this_01,b_00,(KeyNode *)pNVar8);
    pNVar8 = pNVar3;
  } while (pNVar3 != (NodeBase *)0x0);
  return;
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                !TableEntryIsEmpty(index_of_first_non_null_));
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(node->key()).node == nullptr);
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, NodeToVariantKey, node);
    }
  }